

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::re2_internal::Parse<unsigned_long_long>
               (char *str,size_t n,unsigned_long_long *dest,int radix)

{
  int *piVar1;
  ulonglong uVar2;
  unsigned_long_long r;
  char *end;
  char buf [33];
  int radix_local;
  unsigned_long_long *dest_local;
  size_t n_local;
  char *str_local;
  
  if (n == 0) {
    str_local._7_1_ = false;
  }
  else {
    dest_local = (unsigned_long_long *)n;
    n_local = (size_t)str;
    n_local = (size_t)TerminateNumber((char *)&end,0x21,str,(size_t *)&dest_local,false);
    if (*(char *)n_local == '-') {
      str_local._7_1_ = false;
    }
    else {
      piVar1 = __errno_location();
      *piVar1 = 0;
      uVar2 = strtoull((char *)n_local,(char **)&r,radix);
      if (r == n_local + (long)dest_local) {
        piVar1 = __errno_location();
        if (*piVar1 == 0) {
          if (dest == (unsigned_long_long *)0x0) {
            str_local._7_1_ = true;
          }
          else {
            *dest = uVar2;
            str_local._7_1_ = true;
          }
        }
        else {
          str_local._7_1_ = false;
        }
      }
      else {
        str_local._7_1_ = false;
      }
    }
  }
  return str_local._7_1_;
}

Assistant:

bool Parse(const char* str, size_t n, unsigned long long* dest, int radix) {
  if (n == 0) return false;
  char buf[kMaxNumberLength+1];
  str = TerminateNumber(buf, sizeof buf, str, &n, false);
  if (str[0] == '-') {
    // strtoull() will silently accept negative numbers and parse
    // them.  This module is more strict and treats them as errors.
    return false;
  }
  char* end;
  errno = 0;
  unsigned long long r = strtoull(str, &end, radix);
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  *dest = r;
  return true;
}